

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_allocation_callbacks_init_copy
                    (ma_allocation_callbacks *pDst,ma_allocation_callbacks *pSrc)

{
  long *in_RSI;
  long *in_RDI;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  ma_result local_4;
  
  if (in_RDI == (long *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    if (in_RSI == (long *)0x0) {
      ma_allocation_callbacks_init_default();
      *in_RDI = local_38;
      in_RDI[1] = local_30;
      in_RDI[2] = local_28;
      in_RDI[3] = local_20;
    }
    else if ((((*in_RSI == 0) && (in_RSI[3] == 0)) && (in_RSI[1] == 0)) && (in_RSI[2] == 0)) {
      ma_allocation_callbacks_init_default();
      *in_RDI = local_58;
      in_RDI[1] = local_50;
      in_RDI[2] = local_48;
      in_RDI[3] = local_40;
    }
    else {
      if ((in_RSI[3] == 0) || ((in_RSI[1] == 0 && (in_RSI[2] == 0)))) {
        return MA_INVALID_ARGS;
      }
      *in_RDI = *in_RSI;
      in_RDI[1] = in_RSI[1];
      in_RDI[2] = in_RSI[2];
      in_RDI[3] = in_RSI[3];
    }
    local_4 = MA_SUCCESS;
  }
  return local_4;
}

Assistant:

static ma_result ma_allocation_callbacks_init_copy(ma_allocation_callbacks* pDst, const ma_allocation_callbacks* pSrc)
{
    if (pDst == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pSrc == NULL) {
        *pDst = ma_allocation_callbacks_init_default();
    } else {
        if (pSrc->pUserData == NULL && pSrc->onFree == NULL && pSrc->onMalloc == NULL && pSrc->onRealloc == NULL) {
            *pDst = ma_allocation_callbacks_init_default();
        } else {
            if (pSrc->onFree == NULL || (pSrc->onMalloc == NULL && pSrc->onRealloc == NULL)) {
                return MA_INVALID_ARGS;    /* Invalid allocation callbacks. */
            } else {
                *pDst = *pSrc;
            }
        }
    }

    return MA_SUCCESS;
}